

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# planar_functions.cc
# Opt level: O3

int ARGBRect(uint8_t *dst_argb,int dst_stride_argb,int dst_x,int dst_y,int width,int height,
            uint32_t value)

{
  int iVar1;
  uint uVar2;
  uint8_t *puVar3;
  int iVar4;
  code *pcVar5;
  int iVar6;
  bool bVar7;
  
  iVar4 = -1;
  iVar1 = -1;
  if ((((-1 < (dst_y | dst_x)) && (iVar1 = iVar4, dst_argb != (uint8_t *)0x0)) && (0 < width)) &&
     (height != 0)) {
    iVar1 = height;
    if (height < 0) {
      iVar1 = -height;
      dst_argb = dst_argb + ~height * dst_stride_argb;
      dst_stride_argb = -dst_stride_argb;
    }
    bVar7 = dst_stride_argb != width * 4;
    iVar4 = 0;
    if (bVar7) {
      iVar4 = dst_stride_argb;
    }
    iVar6 = 1;
    if (!bVar7) {
      iVar6 = iVar1;
    }
    if (!bVar7) {
      iVar1 = 1;
    }
    uVar2 = cpu_info_;
    if (cpu_info_ == 0) {
      uVar2 = InitCpuFlags();
    }
    if ((uVar2 & 0x10) == 0) {
      pcVar5 = ARGBSetRow_C;
    }
    else {
      pcVar5 = ARGBSetRow_X86;
    }
    puVar3 = dst_argb + (dst_y * dst_stride_argb + dst_x * 4);
    do {
      (*pcVar5)(puVar3,value,iVar6 * width);
      puVar3 = puVar3 + iVar4;
      iVar1 = iVar1 + -1;
    } while (iVar1 != 0);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

LIBYUV_API
int ARGBRect(uint8_t* dst_argb,
             int dst_stride_argb,
             int dst_x,
             int dst_y,
             int width,
             int height,
             uint32_t value) {
  int y;
  void (*ARGBSetRow)(uint8_t * dst_argb, uint32_t value, int width) =
      ARGBSetRow_C;
  if (!dst_argb || width <= 0 || height == 0 || dst_x < 0 || dst_y < 0) {
    return -1;
  }
  if (height < 0) {
    height = -height;
    dst_argb = dst_argb + (height - 1) * dst_stride_argb;
    dst_stride_argb = -dst_stride_argb;
  }
  dst_argb += dst_y * dst_stride_argb + dst_x * 4;
  // Coalesce rows.
  if (dst_stride_argb == width * 4) {
    width *= height;
    height = 1;
    dst_stride_argb = 0;
  }

#if defined(HAS_ARGBSETROW_NEON)
  if (TestCpuFlag(kCpuHasNEON)) {
    ARGBSetRow = ARGBSetRow_Any_NEON;
    if (IS_ALIGNED(width, 4)) {
      ARGBSetRow = ARGBSetRow_NEON;
    }
  }
#endif
#if defined(HAS_ARGBSETROW_X86)
  if (TestCpuFlag(kCpuHasX86)) {
    ARGBSetRow = ARGBSetRow_X86;
  }
#endif
#if defined(HAS_ARGBSETROW_MMI)
  if (TestCpuFlag(kCpuHasMMI)) {
    ARGBSetRow = ARGBSetRow_Any_MMI;
    if (IS_ALIGNED(width, 4)) {
      ARGBSetRow = ARGBSetRow_MMI;
    }
  }
#endif
#if defined(HAS_ARGBSETROW_MSA)
  if (TestCpuFlag(kCpuHasMSA)) {
    ARGBSetRow = ARGBSetRow_Any_MSA;
    if (IS_ALIGNED(width, 4)) {
      ARGBSetRow = ARGBSetRow_MSA;
    }
  }
#endif

  // Set plane
  for (y = 0; y < height; ++y) {
    ARGBSetRow(dst_argb, value, width);
    dst_argb += dst_stride_argb;
  }
  return 0;
}